

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

Normalizer2 * icu_63::Normalizer2Factory::getInstance(UNormalizationMode mode,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  Normalizer2 *pNStack_10;
  UNormalizationMode mode_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    switch(mode) {
    case UNORM_NFD:
      pNStack_10 = Normalizer2::getNFDInstance(errorCode);
      break;
    case UNORM_NFKD:
      pNStack_10 = Normalizer2::getNFKDInstance(errorCode);
      break;
    case UNORM_DEFAULT:
      pNStack_10 = Normalizer2::getNFCInstance(errorCode);
      break;
    case UNORM_NFKC:
      pNStack_10 = Normalizer2::getNFKCInstance(errorCode);
      break;
    case UNORM_FCD:
      pNStack_10 = getFCDInstance(errorCode);
      break;
    default:
      pNStack_10 = getNoopInstance(errorCode);
    }
  }
  else {
    pNStack_10 = (Normalizer2 *)0x0;
  }
  return pNStack_10;
}

Assistant:

const Normalizer2 *
Normalizer2Factory::getInstance(UNormalizationMode mode, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    switch(mode) {
    case UNORM_NFD:
        return Normalizer2::getNFDInstance(errorCode);
    case UNORM_NFKD:
        return Normalizer2::getNFKDInstance(errorCode);
    case UNORM_NFC:
        return Normalizer2::getNFCInstance(errorCode);
    case UNORM_NFKC:
        return Normalizer2::getNFKCInstance(errorCode);
    case UNORM_FCD:
        return getFCDInstance(errorCode);
    default:  // UNORM_NONE
        return getNoopInstance(errorCode);
    }
}